

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ImVector<ImFontAtlasCustomRect> *this;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  stbrp_coord sVar4;
  ImFontAtlasCustomRect *pIVar5;
  stbrp_rect *psVar6;
  int i;
  int iVar7;
  int iVar8;
  ImVector<stbrp_rect> pack_rects;
  ImVector<stbrp_rect> local_48;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa40,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  iVar7 = (atlas->CustomRects).Size;
  if (iVar7 < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa43,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  local_48.Size = 0;
  local_48.Capacity = 0;
  local_48.Data = (stbrp_rect *)0x0;
  ImVector<stbrp_rect>::resize(&local_48,iVar7);
  this = &atlas->CustomRects;
  memset(local_48.Data,0,(long)local_48.Size * 0x18);
  for (iVar7 = 0; iVar7 < this->Size; iVar7 = iVar7 + 1) {
    pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar7);
    uVar1 = pIVar5->Width;
    psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
    psVar6->w = (uint)uVar1;
    pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar7);
    uVar1 = pIVar5->Height;
    psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
    psVar6->h = (uint)uVar1;
  }
  iVar7 = 0;
  psVar6 = ImVector<stbrp_rect>::operator[](&local_48,0);
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psVar6,local_48.Size);
  do {
    if (local_48.Size <= iVar7) {
      ImVector<stbrp_rect>::~ImVector(&local_48);
      return;
    }
    psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
    if (psVar6->was_packed != 0) {
      psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
      sVar4 = psVar6->x;
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar7);
      pIVar5->X = (unsigned_short)sVar4;
      psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
      sVar4 = psVar6->y;
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar7);
      pIVar5->Y = (unsigned_short)sVar4;
      psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
      uVar2 = psVar6->w;
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar7);
      if (uVar2 != pIVar5->Width) {
LAB_0015f830:
        __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                      ,0xa53,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
      }
      psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
      uVar2 = psVar6->h;
      pIVar5 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar7);
      if (uVar2 != pIVar5->Height) goto LAB_0015f830;
      iVar3 = atlas->TexHeight;
      psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
      iVar8 = psVar6->y;
      psVar6 = ImVector<stbrp_rect>::operator[](&local_48,iVar7);
      iVar8 = iVar8 + psVar6->h;
      if (iVar8 < iVar3) {
        iVar8 = iVar3;
      }
      atlas->TexHeight = iVar8;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}